

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LookaheadDFA.hpp
# Opt level: O0

void __thiscall Centaurus::LookaheadDFA<wchar_t>::minimize(LookaheadDFA<wchar_t> *this)

{
  allocator<int> *this_00;
  int iVar1;
  bool bVar2;
  size_type sVar3;
  ulong uVar4;
  reference pvVar5;
  pointer ppVar6;
  reference pvVar7;
  reference rVar8;
  int local_e4;
  int index_1;
  reference local_d0;
  _Node_iterator_base<std::pair<const_Centaurus::LDFAState<wchar_t>,_int>,_true> local_c0;
  _Node_iterator_base<std::pair<const_Centaurus::LDFAState<wchar_t>,_int>,_true> local_b8;
  iterator p;
  undefined1 local_a8 [4];
  int index;
  unordered_map<Centaurus::LDFAState<wchar_t>,_int,_std::hash<Centaurus::LDFAState<wchar_t>_>,_std::equal_to<Centaurus::LDFAState<wchar_t>_>,_std::allocator<std::pair<const_Centaurus::LDFAState<wchar_t>,_int>_>_>
  equiv_map;
  undefined1 local_68 [8];
  vector<int,_std::allocator<int>_> remap;
  allocator<bool> local_3a;
  bool local_39;
  undefined1 local_38 [8];
  vector<bool,_std::allocator<bool>_> mask;
  LookaheadDFA<wchar_t> *this_local;
  
  mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage
       = (_Bit_pointer)this;
  sVar3 = std::
          vector<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>::
          size(&(this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states);
  local_39 = true;
  std::allocator<bool>::allocator(&local_3a);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_38,sVar3,&local_39,&local_3a);
  std::allocator<bool>::~allocator(&local_3a);
  sVar3 = std::
          vector<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>::
          size(&(this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states);
  equiv_map._M_h._M_single_bucket._4_4_ = 0xffffffff;
  this_00 = (allocator<int> *)((long)&equiv_map._M_h._M_single_bucket + 3);
  std::allocator<int>::allocator(this_00);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,sVar3,
             (value_type *)((long)&equiv_map._M_h._M_single_bucket + 4),this_00);
  std::allocator<int>::~allocator((allocator<int> *)((long)&equiv_map._M_h._M_single_bucket + 3));
  std::
  unordered_map<Centaurus::LDFAState<wchar_t>,_int,_std::hash<Centaurus::LDFAState<wchar_t>_>,_std::equal_to<Centaurus::LDFAState<wchar_t>_>,_std::allocator<std::pair<const_Centaurus::LDFAState<wchar_t>,_int>_>_>
  ::unordered_map((unordered_map<Centaurus::LDFAState<wchar_t>,_int,_std::hash<Centaurus::LDFAState<wchar_t>_>,_std::equal_to<Centaurus::LDFAState<wchar_t>_>,_std::allocator<std::pair<const_Centaurus::LDFAState<wchar_t>,_int>_>_>
                   *)local_a8);
  p.super__Node_iterator_base<std::pair<const_Centaurus::LDFAState<wchar_t>,_int>,_true>._M_cur.
  _4_4_ = 0;
  while( true ) {
    uVar4 = (ulong)p.
                   super__Node_iterator_base<std::pair<const_Centaurus::LDFAState<wchar_t>,_int>,_true>
                   ._M_cur._4_4_;
    sVar3 = std::
            vector<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>::
            size(&(this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states);
    if (sVar3 <= uVar4) break;
    pvVar5 = std::
             vector<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
             ::operator[](&(this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states,
                          (long)p.
                                super__Node_iterator_base<std::pair<const_Centaurus::LDFAState<wchar_t>,_int>,_true>
                                ._M_cur._4_4_);
    local_b8._M_cur =
         (__node_type *)
         std::
         unordered_map<Centaurus::LDFAState<wchar_t>,_int,_std::hash<Centaurus::LDFAState<wchar_t>_>,_std::equal_to<Centaurus::LDFAState<wchar_t>_>,_std::allocator<std::pair<const_Centaurus::LDFAState<wchar_t>,_int>_>_>
         ::find((unordered_map<Centaurus::LDFAState<wchar_t>,_int,_std::hash<Centaurus::LDFAState<wchar_t>_>,_std::equal_to<Centaurus::LDFAState<wchar_t>_>,_std::allocator<std::pair<const_Centaurus::LDFAState<wchar_t>,_int>_>_>
                 *)local_a8,pvVar5);
    local_c0._M_cur =
         (__node_type *)
         std::
         unordered_map<Centaurus::LDFAState<wchar_t>,_int,_std::hash<Centaurus::LDFAState<wchar_t>_>,_std::equal_to<Centaurus::LDFAState<wchar_t>_>,_std::allocator<std::pair<const_Centaurus::LDFAState<wchar_t>,_int>_>_>
         ::end((unordered_map<Centaurus::LDFAState<wchar_t>,_int,_std::hash<Centaurus::LDFAState<wchar_t>_>,_std::equal_to<Centaurus::LDFAState<wchar_t>_>,_std::allocator<std::pair<const_Centaurus::LDFAState<wchar_t>,_int>_>_>
                *)local_a8);
    bVar2 = std::__detail::operator!=(&local_b8,&local_c0);
    if (bVar2) {
      ppVar6 = std::__detail::
               _Node_iterator<std::pair<const_Centaurus::LDFAState<wchar_t>,_int>,_false,_true>::
               operator->((_Node_iterator<std::pair<const_Centaurus::LDFAState<wchar_t>,_int>,_false,_true>
                           *)&local_b8);
      iVar1 = ppVar6->second;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_68,
                          (long)p.
                                super__Node_iterator_base<std::pair<const_Centaurus::LDFAState<wchar_t>,_int>,_true>
                                ._M_cur._4_4_);
      *pvVar7 = iVar1;
      rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)local_38,
                         (long)p.
                               super__Node_iterator_base<std::pair<const_Centaurus::LDFAState<wchar_t>,_int>,_true>
                               ._M_cur._4_4_);
      local_d0 = rVar8;
      std::_Bit_reference::operator=(&local_d0,false);
    }
    else {
      pvVar5 = std::
               vector<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
               ::operator[](&(this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states,
                            (long)p.
                                  super__Node_iterator_base<std::pair<const_Centaurus::LDFAState<wchar_t>,_int>,_true>
                                  ._M_cur._4_4_);
      std::
      unordered_map<Centaurus::LDFAState<wchar_t>,int,std::hash<Centaurus::LDFAState<wchar_t>>,std::equal_to<Centaurus::LDFAState<wchar_t>>,std::allocator<std::pair<Centaurus::LDFAState<wchar_t>const,int>>>
      ::emplace<Centaurus::LDFAState<wchar_t>&,int&>
                ((unordered_map<Centaurus::LDFAState<wchar_t>,int,std::hash<Centaurus::LDFAState<wchar_t>>,std::equal_to<Centaurus::LDFAState<wchar_t>>,std::allocator<std::pair<Centaurus::LDFAState<wchar_t>const,int>>>
                  *)local_a8,pvVar5,
                 (int *)((long)&p.
                                super__Node_iterator_base<std::pair<const_Centaurus::LDFAState<wchar_t>,_int>,_true>
                                ._M_cur + 4));
    }
    p.super__Node_iterator_base<std::pair<const_Centaurus::LDFAState<wchar_t>,_int>,_true>._M_cur.
    _4_4_ = p.super__Node_iterator_base<std::pair<const_Centaurus::LDFAState<wchar_t>,_int>,_true>.
            _M_cur._4_4_ + 1;
  }
  local_e4 = 0;
  while( true ) {
    sVar3 = std::
            vector<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>::
            size(&(this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states);
    if (sVar3 <= (ulong)(long)local_e4) break;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_68,(long)local_e4);
    if (-1 < *pvVar7) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_68,(long)local_e4);
      redirect_transitions(this,local_e4,*pvVar7);
    }
    local_e4 = local_e4 + 1;
  }
  filter_nodes(this,(vector<bool,_std::allocator<bool>_> *)local_38);
  std::
  unordered_map<Centaurus::LDFAState<wchar_t>,_int,_std::hash<Centaurus::LDFAState<wchar_t>_>,_std::equal_to<Centaurus::LDFAState<wchar_t>_>,_std::allocator<std::pair<const_Centaurus::LDFAState<wchar_t>,_int>_>_>
  ::~unordered_map((unordered_map<Centaurus::LDFAState<wchar_t>,_int,_std::hash<Centaurus::LDFAState<wchar_t>_>,_std::equal_to<Centaurus::LDFAState<wchar_t>_>,_std::allocator<std::pair<const_Centaurus::LDFAState<wchar_t>,_int>_>_>
                    *)local_a8);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_68);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_38)
  ;
  return;
}

Assistant:

void minimize()
    {
        std::vector<bool> mask(m_states.size(), true);
        std::vector<int> remap(m_states.size(), -1);

        std::unordered_map<LDFAState<TCHAR>, int> equiv_map;

        for (int index = 0; index < m_states.size(); index++)
        {
            auto p = equiv_map.find(m_states[index]);
            if (p != equiv_map.end())
            {
                remap[index] = p->second;
                mask[index] = false;
            }
            else
            {
                equiv_map.emplace(m_states[index], index);
            }
        }

        for (int index = 0; index < m_states.size(); index++)
        {
            if (remap[index] >= 0)
            {
                redirect_transitions(index, remap[index]);
            }
        }
        filter_nodes(mask);
    }